

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeBuilders.cpp
# Opt level: O2

float __thiscall
Opcode::AABBTreeOfVerticesBuilder::GetSplittingValue
          (AABBTreeOfVerticesBuilder *this,udword *primitives,udword nb_prims,AABB *global_box,
          udword axis)

{
  ulong uVar1;
  float fVar2;
  
  if (((this->super_AABBTreeBuilder).mSettings.mRules & 0x20) == 0) {
    return (&(global_box->mCenter).x)[axis];
  }
  fVar2 = 0.0;
  for (uVar1 = 0; nb_prims != uVar1; uVar1 = uVar1 + 1) {
    fVar2 = fVar2 + (&this->mVertexArray[primitives[uVar1]].x)[axis];
  }
  return fVar2 / (float)nb_prims;
}

Assistant:

float AABBTreeOfVerticesBuilder::GetSplittingValue(const udword* primitives, udword nb_prims, const AABB& global_box, udword axis)	const
{
	if(mSettings.mRules&SPLIT_GEOM_CENTER)
	{
		// Loop through vertices
		float SplitValue = 0.0f;
		for(udword i=0;i<nb_prims;i++)
		{
			// Update split value
			SplitValue += mVertexArray[primitives[i]][axis];
		}
		return SplitValue / float(nb_prims);
	}
	else return AABBTreeBuilder::GetSplittingValue(primitives, nb_prims, global_box, axis);
}